

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O0

int hts_itr_next(BGZF *fp,hts_itr_t *iter,void *r,void *data)

{
  long lVar1;
  long lVar2;
  int local_40;
  int local_3c;
  int end;
  int beg;
  int tid;
  int ret;
  void *data_local;
  void *r_local;
  hts_itr_t *iter_local;
  BGZF *fp_local;
  
  if ((iter == (hts_itr_t *)0x0) || ((*(uint *)iter >> 1 & 1) != 0)) {
    fp_local._4_4_ = -1;
  }
  else {
    _tid = data;
    data_local = r;
    r_local = iter;
    iter_local = (hts_itr_t *)fp;
    if (((undefined1  [80])*iter & (undefined1  [80])0x1) == (undefined1  [80])0x0) {
      if (iter->off == (hts_pair64_t *)0x0) {
        fp_local._4_4_ = -1;
      }
      else {
        do {
          if ((*(long *)((long)r_local + 0x28) == 0) ||
             (*(ulong *)(*(long *)((long)r_local + 0x30) +
                         (long)*(int *)((long)r_local + 0x14) * 0x10 + 8) <=
              *(ulong *)((long)r_local + 0x28))) {
            if (*(int *)((long)r_local + 0x14) == *(int *)((long)r_local + 0x10) + -1) {
              beg = -1;
              goto LAB_00112006;
            }
            if ((*(int *)((long)r_local + 0x14) < 0) ||
               (*(long *)(*(long *)((long)r_local + 0x30) +
                          (long)*(int *)((long)r_local + 0x14) * 0x10 + 8) !=
                *(long *)(*(long *)((long)r_local + 0x30) +
                         (long)(*(int *)((long)r_local + 0x14) + 1) * 0x10))) {
              bgzf_seek((BGZF *)iter_local,
                        *(int64_t *)
                         (*(long *)((long)r_local + 0x30) +
                         (long)(*(int *)((long)r_local + 0x14) + 1) * 0x10),0);
              lVar1._0_4_ = iter_local->n_off;
              lVar1._4_4_ = iter_local->i;
              *(long *)((long)r_local + 0x28) =
                   lVar1 << 0x10 | (long)(int)(iter_local->end & 0xffff);
            }
            *(int *)((long)r_local + 0x14) = *(int *)((long)r_local + 0x14) + 1;
          }
          beg = (**(code **)((long)r_local + 0x38))
                          (iter_local,_tid,data_local,&end,&local_3c,&local_40);
          if (beg < 0) {
LAB_00112006:
            *(uint *)r_local = *r_local & 0xfffffffd | 2;
            return beg;
          }
          lVar2._0_4_ = iter_local->n_off;
          lVar2._4_4_ = iter_local->i;
          *(long *)((long)r_local + 0x28) = lVar2 << 0x10 | (long)(int)(iter_local->end & 0xffff);
          if ((end != *(int *)((long)r_local + 4)) || (*(int *)((long)r_local + 0xc) <= local_3c)) {
            beg = -1;
            goto LAB_00112006;
          }
        } while ((local_40 <= *(int *)((long)r_local + 8)) ||
                (*(int *)((long)r_local + 0xc) <= local_3c));
        *(int *)((long)r_local + 0x18) = end;
        *(int *)((long)r_local + 0x1c) = local_3c;
        *(int *)((long)r_local + 0x20) = local_40;
        fp_local._4_4_ = beg;
      }
    }
    else {
      if (iter->curr_off != 0) {
        bgzf_seek(fp,iter->curr_off,0);
        *(undefined8 *)((long)r_local + 0x28) = 0;
      }
      fp_local._4_4_ =
           (**(code **)((long)r_local + 0x38))(iter_local,_tid,data_local,&end,&local_3c,&local_40);
      if (fp_local._4_4_ < 0) {
        *(uint *)r_local = *r_local & 0xfffffffd | 2;
      }
      *(int *)((long)r_local + 0x18) = end;
      *(int *)((long)r_local + 0x1c) = local_3c;
      *(int *)((long)r_local + 0x20) = local_40;
    }
  }
  return fp_local._4_4_;
}

Assistant:

int hts_itr_next(BGZF *fp, hts_itr_t *iter, void *r, void *data)
{
    int ret, tid, beg, end;
    if (iter == NULL || iter->finished) return -1;
    if (iter->read_rest) {
        if (iter->curr_off) { // seek to the start
            bgzf_seek(fp, iter->curr_off, SEEK_SET);
            iter->curr_off = 0; // only seek once
        }
        ret = iter->readrec(fp, data, r, &tid, &beg, &end);
        if (ret < 0) iter->finished = 1;
        iter->curr_tid = tid;
        iter->curr_beg = beg;
        iter->curr_end = end;
        return ret;
    }
    if (iter->off == 0) return -1;
    for (;;) {
        if (iter->curr_off == 0 || iter->curr_off >= iter->off[iter->i].v) { // then jump to the next chunk
            if (iter->i == iter->n_off - 1) { ret = -1; break; } // no more chunks
            if (iter->i < 0 || iter->off[iter->i].v != iter->off[iter->i+1].u) { // not adjacent chunks; then seek
                bgzf_seek(fp, iter->off[iter->i+1].u, SEEK_SET);
                iter->curr_off = bgzf_tell(fp);
            }
            ++iter->i;
        }
        if ((ret = iter->readrec(fp, data, r, &tid, &beg, &end)) >= 0) {
            iter->curr_off = bgzf_tell(fp);
            if (tid != iter->tid || beg >= iter->end) { // no need to proceed
                ret = -1; break;
            } else if (end > iter->beg && iter->end > beg) {
                iter->curr_tid = tid;
                iter->curr_beg = beg;
                iter->curr_end = end;
                return ret;
            }
        } else break; // end of file or error
    }
    iter->finished = 1;
    return ret;
}